

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O3

errr Infoclr_init_data(Pixell fg,Pixell bg,wchar_t op,wchar_t stip)

{
  infoclr *piVar1;
  errr in_EAX;
  GC p_Var2;
  XGCValues gcv;
  
  piVar1 = Infoclr;
  if ((uint)op < 0x10) {
    p_Var2 = metadpy_default_15;
    if ((bg <= metadpy_default_15) && (fg <= metadpy_default_15)) {
      p_Var2 = (GC)XCreateGC(metadpy_default_0,metadpy_default_2,0x1010d);
      *(undefined8 *)&piVar1->field_0x18 = 0;
      piVar1->gc = p_Var2;
      piVar1->fg = fg;
      piVar1->bg = bg;
      piVar1->field_0x18 = (byte)op | 0x20;
    }
    in_EAX = (errr)p_Var2;
  }
  return in_EAX;
}

Assistant:

static errr Infoclr_init_data(Pixell fg, Pixell bg, int op, int stip)
{
	infoclr *iclr = Infoclr;

	GC gc;
	XGCValues gcv;
	unsigned long gc_mask;

	/*** Simple error checking of opr and clr ***/

	/* Check the 'Pixells' for realism */
	if (bg > Metadpy->zg) return (-1);
	if (fg > Metadpy->zg) return (-1);

	/* Check the data for trueness */
	if ((op < 0) || (op > 15)) return (-1);

	/*** Create the requested 'GC' ***/

	/* Assign the proper GC function */
	gcv.function = op;

	/* Assign the proper GC background */
	gcv.background = bg;

	/* Assign the proper GC foreground */
	gcv.foreground = fg;

	/* Hack -- Handle XOR (xor is code 6) by hacking bg and fg */
	if (op == 6) gcv.background = 0;
	if (op == 6) gcv.foreground = (bg ^ fg);

	/* Assign the proper GC Fill Style */
	gcv.fill_style = (stip ? FillStippled : FillSolid);

	/* Turn off 'Give exposure events for pixmap copying' */
	gcv.graphics_exposures = False;

	/* Set up the GC mask */
	gc_mask = (GCFunction | GCBackground | GCForeground |
	           GCFillStyle | GCGraphicsExposures);

	/* Create the GC detailed above */
	gc = XCreateGC(Metadpy->dpy, Metadpy->root, gc_mask, &gcv);


	/*** Initialize ***/

	/* Wipe the iclr clean */
	(void)memset(iclr, 0, sizeof(infoclr));

	/* Assign the GC */
	iclr->gc = gc;

	/* Nuke it when done */
	iclr->nuke = 1;

	/* Assign the parms */
	iclr->fg = fg;
	iclr->bg = bg;
	iclr->code = op;
	iclr->stip = stip ? 1 : 0;

	/* Success */
	return (0);
}